

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

void __thiscall
CCharmapToLocal::set_mapping(CCharmapToLocal *this,wchar_t unicode_char,uint xlat_offset)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = (uint)unicode_char >> 8 & 0xff;
  puVar1 = this->map_[uVar3];
  if (puVar1 == (uint *)0x0) {
    puVar1 = (uint *)malloc(0x400);
    this->map_[uVar3] = puVar1;
    lVar2 = 0;
    do {
      this->map_[uVar3][lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
    puVar1 = this->map_[uVar3];
  }
  puVar1[(uint)(unicode_char & 0xff)] = xlat_offset;
  return;
}

Assistant:

void CCharmapToLocal::set_mapping(wchar_t unicode_char,
                                  unsigned int xlat_offset)
{
    int master_idx;
    
    /* get the master table index for this unicode character */
    master_idx = (int)((unicode_char >> 8) & 0xff);
    
    /* if there's no sub-table here yet, create one */
    if (map_[master_idx] == 0)
    {
        int i;
        
        /* allocate it */
        map_[master_idx] =
            (unsigned int *)t3malloc(256 * sizeof(unsigned int));
        
        /* 
         *   Set each entry to the default character, so that it will
         *   produce valid results if no mapping is ever specified for the
         *   character.  The default character is always at offset zero in
         *   the translation array.  
         */
        for (i = 0 ; i < 256 ; ++i)
            map_[master_idx][i] = 0;
    }
    
    /* set the mapping for the character's entry in the sub-table */
    map_[master_idx][unicode_char & 0xff] = xlat_offset;
}